

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O2

void __thiscall HinOut::HinOutTestIO(HinOut *this,HModel *ptr)

{
  ostream *poVar1;
  
  HinOutTestWrite(this,ptr);
  HinOutTestRead(this,ptr);
  compareData(this,2);
  poVar1 = std::operator<<((ostream *)&std::cout," DATA IS THE SAME");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void HinOut::HinOutTestIO(HModel & ptr) {

	HinOutTestWrite(ptr);
	//clearData();
	HinOutTestRead(ptr);

	compareData(2); cout<<" DATA IS THE SAME"<<endl;
}